

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opusfile.c
# Opt level: O2

int op_stereo_filter(OggOpusFile *_of,void *_dst,int _dst_sz,op_sample *_src,int _nsamples,
                    int _nchannels)

{
  op_sample oVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  int ci;
  float fVar7;
  float fVar8;
  
  uVar5 = (ulong)(uint)(_dst_sz >> 1);
  if (_nsamples <= _dst_sz >> 1) {
    uVar5 = (ulong)(uint)_nsamples;
  }
  iVar4 = (int)uVar5;
  if (_nchannels == 2) {
    memcpy(_dst,_src,(long)(iVar4 * 2) << 2);
  }
  else if (_nchannels == 1) {
    uVar2 = 0;
    uVar3 = 0;
    if (0 < iVar4) {
      uVar3 = uVar5;
    }
    for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      oVar1 = _src[uVar2];
      *(op_sample *)((long)_dst + uVar2 * 8 + 4) = oVar1;
      *(op_sample *)((long)_dst + uVar2 * 8) = oVar1;
    }
  }
  else {
    uVar3 = 0;
    uVar2 = 0;
    if (0 < _nchannels) {
      uVar2 = (ulong)(uint)_nchannels;
    }
    uVar6 = 0;
    if (0 < iVar4) {
      uVar6 = uVar5;
    }
    for (; uVar3 != uVar6; uVar3 = uVar3 + 1) {
      fVar7 = 0.0;
      fVar8 = 0.0;
      for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
        fVar7 = fVar7 + _src[uVar5] * SUB84(OP_STEREO_DOWNMIX[_nchannels + -3][uVar5],0);
        fVar8 = fVar8 + _src[uVar5] * SUB84(OP_STEREO_DOWNMIX[_nchannels + -3][uVar5],4);
      }
      *(ulong *)((long)_dst + uVar3 * 8) = CONCAT44(fVar8,fVar7);
      _src = _src + _nchannels;
    }
  }
  return iVar4;
}

Assistant:

static int op_stereo_filter(OggOpusFile *_of,void *_dst,int _dst_sz,
 op_sample *_src,int _nsamples,int _nchannels){
  (void)_of;
  _nsamples=OP_MIN(_nsamples,_dst_sz>>1);
  if(_nchannels==2)memcpy(_dst,_src,_nsamples*2*sizeof(*_src));
  else{
    float *dst;
    int    i;
    dst=(float *)_dst;
    if(_nchannels==1){
      for(i=0;i<_nsamples;i++)dst[2*i+0]=dst[2*i+1]=_src[i];
    }
    else{
      for(i=0;i<_nsamples;i++){
        float l;
        float r;
        int   ci;
        l=r=0;
        for(ci=0;ci<_nchannels;ci++){
          l+=OP_STEREO_DOWNMIX[_nchannels-3][ci][0]*_src[_nchannels*i+ci];
          r+=OP_STEREO_DOWNMIX[_nchannels-3][ci][1]*_src[_nchannels*i+ci];
        }
        dst[2*i+0]=l;
        dst[2*i+1]=r;
      }
    }
  }
  return _nsamples;
}